

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::IsSpecifiedOnCommandLine(FlagImpl *this)

{
  byte bVar1;
  MutexLock l;
  MutexLock local_18;
  
  local_18.mu_ = DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  bVar1 = this->field_0x29;
  MutexLock::~MutexLock(&local_18);
  return (bool)((bVar1 & 8) >> 3);
}

Assistant:

bool FlagImpl::IsSpecifiedOnCommandLine() const {
  absl::MutexLock l(DataGuard());
  return on_command_line_;
}